

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD3Loader.cpp
# Opt level: O2

bool Assimp::Q3Shader::LoadSkin(SkinData *fill,string *pFile,IOSystem *io)

{
  _List_node_base *p_Var1;
  int iVar2;
  undefined4 extraout_var;
  Logger *this;
  long lVar4;
  char **in;
  size_type __n;
  char **in_00;
  pointer pcVar5;
  char *buff;
  vector<char,_std::allocator<char>_> _buff;
  value_type local_98;
  string ss;
  long *plVar3;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"rt",(allocator<char> *)&ss);
  iVar2 = (*io->_vptr_IOSystem[4])
                    (io,(pFile->_M_dataplus)._M_p,
                     local_98.
                     super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .first._M_dataplus._M_p);
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  std::__cxx11::string::~string((string *)&local_98);
  if (plVar3 != (long *)0x0) {
    this = DefaultLogger::get();
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98,
                   "Loading Quake3 skin file ",pFile);
    Logger::info(this,local_98.
                      super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .first._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_98);
    lVar4 = (**(code **)(*plVar3 + 0x30))();
    std::vector<char,_std::allocator<char>_>::vector(&_buff,lVar4 + 1,(allocator_type *)&local_98);
    pcVar5 = _buff.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start;
    buff = _buff.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start;
    (**(code **)(*plVar3 + 0x10))
              (plVar3,_buff.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,lVar4,1);
    _buff.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
    [lVar4] = '\0';
    local_98.
    super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .first._M_dataplus._M_p._0_1_ = 0x2c;
    ss._M_dataplus._M_p._0_1_ = 0x20;
    std::replace<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,char>
              ((__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
               _buff.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
               ._M_start,
               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
               _buff.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
               ._M_finish,(char *)&local_98,(char *)&ss);
    while (*pcVar5 != '\0') {
      SkipSpacesAndLineEnd<char>(&buff);
      GetNextToken_abi_cxx11_(&ss,(Assimp *)&buff,in);
      __n = ss._M_string_length;
      if (3 < ss._M_string_length) {
        __n = 4;
      }
      iVar2 = strncmp((char *)CONCAT71(ss._M_dataplus._M_p._1_7_,ss._M_dataplus._M_p._0_1_),"tag_",
                      __n);
      if (iVar2 != 0) {
        local_98.
        super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .second.field_2._8_8_ = 0;
        local_98.
        super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .second._M_string_length = 0;
        local_98.
        super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .first.field_2._M_allocated_capacity = 0;
        local_98.
        super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .first.field_2._8_8_ = 0;
        local_98.resolved = false;
        local_98._65_7_ = 0;
        local_98.
        super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .first._M_string_length = 0;
        local_98.
        super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .second._M_dataplus._M_p =
             (pointer)&local_98.
                       super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       .second.field_2;
        local_98.
        super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .second.field_2._M_allocated_capacity = 0;
        local_98.
        super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .first._M_dataplus._M_p =
             (pointer)&local_98.
                       super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       .first.field_2;
        std::__cxx11::
        list<Assimp::Q3Shader::SkinData::TextureEntry,_std::allocator<Assimp::Q3Shader::SkinData::TextureEntry>_>
        ::push_back(&fill->textures,&local_98);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair(&local_98.
                 super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               );
        p_Var1 = (fill->textures).
                 super__List_base<Assimp::Q3Shader::SkinData::TextureEntry,_std::allocator<Assimp::Q3Shader::SkinData::TextureEntry>_>
                 ._M_impl._M_node.super__List_node_base._M_prev;
        std::__cxx11::string::_M_assign((string *)(p_Var1 + 1));
        GetNextToken_abi_cxx11_((string *)&local_98,(Assimp *)&buff,in_00);
        std::__cxx11::string::operator=((string *)(p_Var1 + 3),(string *)&local_98);
        std::__cxx11::string::~string((string *)&local_98);
      }
      std::__cxx11::string::~string((string *)&ss);
      pcVar5 = buff;
    }
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&_buff.super__Vector_base<char,_std::allocator<char>_>);
    (**(code **)(*plVar3 + 8))(plVar3);
  }
  return plVar3 != (long *)0x0;
}

Assistant:

bool Q3Shader::LoadSkin(SkinData& fill, const std::string& pFile,IOSystem* io)
{
    std::unique_ptr<IOStream> file( io->Open( pFile, "rt"));
    if (!file.get())
        return false; // if we can't access the file, don't worry and return

    ASSIMP_LOG_INFO("Loading Quake3 skin file " + pFile);

    // read file in memory
    const size_t s = file->FileSize();
    std::vector<char> _buff(s+1);const char* buff = &_buff[0];
    file->Read(&_buff[0],s,1);
    _buff[s] = 0;

    // remove commas
    std::replace(_buff.begin(),_buff.end(),',',' ');

    // read token by token and fill output table
    for (;*buff;) {
        SkipSpacesAndLineEnd(&buff);

        // get first identifier
        std::string ss = GetNextToken(buff);

        // ignore tokens starting with tag_
        if (!::strncmp(&ss[0],"tag_",std::min((size_t)4, ss.length())))
            continue;

        fill.textures.push_back(SkinData::TextureEntry());
        SkinData::TextureEntry &entry = fill.textures.back();

        entry.first  = ss;
        entry.second = GetNextToken(buff);
    }
    return true;
}